

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvTools.cpp
# Opt level: O0

void glslang::SpirvToolsStripDebugInfo
               (TIntermediate *intermediate,
               vector<unsigned_int,_std::allocator<unsigned_int>_> *spirv,SpvBuildLogger *logger)

{
  spv_target_env env;
  SpvVersion *pSVar1;
  uint *original_binary;
  size_type original_binary_size;
  spv_optimizer_options opt_options;
  OptimizerOptions local_60;
  OptimizerOptions spvOptOptions;
  MessageConsumer local_50;
  Optimizer local_30;
  Optimizer optimizer;
  spv_target_env target_env;
  SpvBuildLogger *logger_local;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *spirv_local;
  TIntermediate *intermediate_local;
  
  pSVar1 = TIntermediate::getSpv(intermediate);
  optimizer.impl_._M_t.
  super___uniq_ptr_impl<spvtools::Optimizer::Impl,_std::default_delete<spvtools::Optimizer::Impl>_>.
  _M_t.
  super__Tuple_impl<0UL,_spvtools::Optimizer::Impl_*,_std::default_delete<spvtools::Optimizer::Impl>_>
  .super__Head_base<0UL,_spvtools::Optimizer::Impl_*,_false>._M_head_impl._4_4_ =
       MapToSpirvToolsEnv(pSVar1,logger);
  spvtools::Optimizer::Optimizer
            (&local_30,
             optimizer.impl_._M_t.
             super___uniq_ptr_impl<spvtools::Optimizer::Impl,_std::default_delete<spvtools::Optimizer::Impl>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::Optimizer::Impl_*,_std::default_delete<spvtools::Optimizer::Impl>_>
             .super__Head_base<0UL,_spvtools::Optimizer::Impl_*,_false>._M_head_impl._4_4_);
  std::function<void(spv_message_level_t,char_const*,spv_position_t_const&,char_const*)>::
  function<void(&)(spv_message_level_t,char_const*,spv_position_t_const&,char_const*),void>
            ((function<void(spv_message_level_t,char_const*,spv_position_t_const&,char_const*)> *)
             &local_50,OptimizerMesssageConsumer);
  spvtools::Optimizer::SetMessageConsumer(&local_30,&local_50);
  std::function<void_(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*)>::
  ~function(&local_50);
  spvtools::CreateStripDebugInfoPass();
  spvtools::Optimizer::RegisterPass(&local_30,(PassToken *)&spvOptOptions);
  spvtools::Optimizer::PassToken::~PassToken((PassToken *)&spvOptOptions);
  spvtools::OptimizerOptions::OptimizerOptions(&local_60);
  pSVar1 = TIntermediate::getSpv(intermediate);
  env = MapToSpirvToolsEnv(pSVar1,logger);
  spvtools::Optimizer::SetTargetEnv(&local_30,env);
  spvtools::OptimizerOptions::set_run_validator(&local_60,false);
  original_binary = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::data(spirv);
  original_binary_size = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(spirv);
  opt_options = spvtools::OptimizerOptions::operator_cast_to_spv_optimizer_options_t_(&local_60);
  spvtools::Optimizer::Run(&local_30,original_binary,original_binary_size,spirv,opt_options);
  spvtools::OptimizerOptions::~OptimizerOptions(&local_60);
  spvtools::Optimizer::~Optimizer(&local_30);
  return;
}

Assistant:

void SpirvToolsStripDebugInfo(const glslang::TIntermediate& intermediate,
        std::vector<unsigned int>& spirv, spv::SpvBuildLogger* logger)
{
    spv_target_env target_env = MapToSpirvToolsEnv(intermediate.getSpv(), logger);

    spvtools::Optimizer optimizer(target_env);
    optimizer.SetMessageConsumer(OptimizerMesssageConsumer);

    optimizer.RegisterPass(spvtools::CreateStripDebugInfoPass());

    spvtools::OptimizerOptions spvOptOptions;
    optimizer.SetTargetEnv(MapToSpirvToolsEnv(intermediate.getSpv(), logger));
    spvOptOptions.set_run_validator(false); // The validator may run as a separate step later on
    optimizer.Run(spirv.data(), spirv.size(), &spirv, spvOptOptions);
}